

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_ExtractChannel(ExtractChannelForm2 ExtractChannel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  ImageTemplate<unsigned_char> local_48;
  
  Unit_Test::intensityArray(&intensity,3);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&input,value,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  Unit_Test::fillImage(&input,0,0,input._width,input._height,&intensity);
  uVar2 = rand();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_48,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&output,input._width,input._height,&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_48);
  (*ExtractChannel)(&input,&output,(uint8_t)((ulong)uVar2 % 3));
  bVar1 = Unit_Test::verifyImage
                    (&output,intensity.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar2 % 3]);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1 && output._colorCount == '\x01';
}

Assistant:

bool form2_ExtractChannel(ExtractChannelForm2 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );
        PenguinV_Image::Image output = uniformImage( input.width(), input.height() );

        ExtractChannel( input, output, channelId );

        return verifyImage( output, intensity[channelId] ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }